

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moldudp64.hh
# Opt level: O2

void __thiscall
helix::nasdaq::moldudp64_session<helix::parity::pmd_handler>::retransmit_request
          (moldudp64_session<helix::parity::pmd_handler> *this,uint64_t seq_no,
          uint64_t expected_seq_no)

{
  runtime_error *this_00;
  allocator local_e1;
  moldudp64_request_packet request_packet;
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((this->_send_cb).super__Function_base._M_manager != (_Manager_type)0x0) {
    request_packet.SequenceNumber =
         expected_seq_no >> 0x38 | (expected_seq_no & 0xff000000000000) >> 0x28 |
         (expected_seq_no & 0xff0000000000) >> 0x18 | (expected_seq_no & 0xff00000000) >> 8 |
         (expected_seq_no & 0xff000000) << 8 | (expected_seq_no & 0xff0000) << 0x18 |
         (expected_seq_no & 0xff00) << 0x28 | expected_seq_no << 0x38;
    request_packet.MessageCount = 0xfeff;
    std::function<void_(char_*,_unsigned_long)>::operator()
              (&this->_send_cb,request_packet.Session,0x14);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_80,"invalid sequence number: ",&local_e1);
  std::__cxx11::to_string(&local_a0,seq_no);
  std::operator+(&local_60,&local_80,&local_a0);
  std::operator+(&local_40,&local_60,", expected: ");
  std::__cxx11::to_string(&local_c0,expected_seq_no);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &request_packet,&local_40,&local_c0);
  std::runtime_error::runtime_error(this_00,(string *)&request_packet);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void moldudp64_session<Handler>::retransmit_request(uint64_t seq_no, uint64_t expected_seq_no)
{
    if (!bool(_send_cb)) {
         throw std::runtime_error(std::string("invalid sequence number: ") + std::to_string(seq_no) + ", expected: " + std::to_string(expected_seq_no));
    }
    uint64_t message_count = 0xfffe;

    moldudp64_request_packet request_packet;
    request_packet.SequenceNumber = htobe64(expected_seq_no);
    request_packet.MessageCount = htobe16(message_count);

    char *base = reinterpret_cast<char*>(&request_packet);
    size_t len = sizeof(request_packet);

    _send_cb(base, len);
}